

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::Context::applyCommandLine(Context *this,int argc,char **argv)

{
  String *pSVar1;
  char *pcVar2;
  ContextState *pCVar3;
  size_t sVar4;
  char *__dest;
  anon_union_24_2_13149d16_for_String_3 local_40;
  
  parseArgs(this,argc,argv,false);
  if (argc != 0) {
    pcVar2 = *argv;
    sVar4 = strlen(pcVar2);
    __dest = String::allocate((String *)&local_40.data,(size_type)sVar4);
    memcpy(__dest,pcVar2,sVar4 & 0xffffffff);
    pCVar3 = this->p;
    pSVar1 = &(pCVar3->super_ContextOptions).binary_name;
    if (&pSVar1->field_0 != &local_40) {
      if (((pCVar3->super_ContextOptions).binary_name.field_0.buf[0x17] < '\0') &&
         (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
        operator_delete__(pcVar2);
      }
      *(ulong *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 0x10) =
           CONCAT17(local_40.buf[0x17],local_40._16_7_);
      (pSVar1->field_0).data.ptr = (char *)CONCAT71(local_40._1_7_,local_40.buf[0]);
      *(undefined8 *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 8) =
           local_40._8_8_;
      local_40.buf[0] = '\0';
      local_40.buf[0x17] = '\x17';
    }
    if ((local_40.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_40._1_7_,local_40.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_40._1_7_,local_40.buf[0]));
    }
  }
  return;
}

Assistant:

void Context::applyCommandLine(int argc, const char* const* argv) {
    parseArgs(argc, argv);
    if(argc)
        p->binary_name = argv[0];
}